

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::DictVectorizer::MergeFrom(DictVectorizer *this,DictVectorizer *from)

{
  ulong uVar1;
  LogMessage *other;
  Int64Vector *this_00;
  StringVector *this_01;
  undefined1 *puVar2;
  Arena *pAVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/DictVectorizer.pb.cc"
               ,0x135);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->_oneof_case_[0] != 1) {
    if (from->_oneof_case_[0] != 2) goto LAB_003231dc;
    if (this->_oneof_case_[0] == 2) {
      this_00 = (this->Map_).int64toindex_;
LAB_00323185:
      puVar2 = (undefined1 *)(from->Map_).int64toindex_;
    }
    else {
      clear_Map(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                          (pAVar3);
      (this->Map_).int64toindex_ = this_00;
      if (from->_oneof_case_[0] == 2) goto LAB_00323185;
      puVar2 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_00,(Int64Vector *)puVar2);
    goto LAB_003231dc;
  }
  if (this->_oneof_case_[0] == 1) {
    this_01 = (this->Map_).stringtoindex_;
LAB_003231bc:
    puVar2 = (undefined1 *)(from->Map_).stringtoindex_;
  }
  else {
    clear_Map(this);
    this->_oneof_case_[0] = 1;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                        (pAVar3);
    (this->Map_).stringtoindex_ = this_01;
    if (from->_oneof_case_[0] == 1) goto LAB_003231bc;
    puVar2 = _StringVector_default_instance_;
  }
  StringVector::MergeFrom(this_01,(StringVector *)puVar2);
LAB_003231dc:
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void DictVectorizer::MergeFrom(const DictVectorizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DictVectorizer)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.Map_case()) {
    case kStringToIndex: {
      _internal_mutable_stringtoindex()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringtoindex());
      break;
    }
    case kInt64ToIndex: {
      _internal_mutable_int64toindex()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64toindex());
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}